

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O1

uint64_t websocket_client_wrap
                   (void *target,void *msg,uint64_t len,uchar opcode,uchar first,uchar last,
                   uchar rsv)

{
  uint uVar1;
  long lVar2;
  undefined1 uVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  undefined7 in_register_00000081;
  long lVar7;
  long lVar8;
  long lVar9;
  
  uVar1 = rand();
  bVar6 = opcode & 0xf;
  if ((int)CONCAT71(in_register_00000081,first) == 0) {
    bVar6 = first;
  }
  *(byte *)target = last << 7 | bVar6;
  bVar6 = (byte)len;
  if (len < 0x7e) {
    bVar6 = bVar6 | 0x80;
    lVar9 = 6;
    lVar2 = 5;
    lVar8 = 4;
    lVar4 = 3;
    lVar5 = 2;
    lVar7 = 1;
  }
  else {
    uVar3 = (undefined1)(len >> 8);
    if (len < 0x10000) {
      *(undefined1 *)((long)target + 1) = 0xfe;
      *(undefined1 *)((long)target + 2) = uVar3;
      lVar9 = 8;
      lVar2 = 7;
      lVar8 = 6;
      lVar4 = 5;
      lVar5 = 4;
      lVar7 = 3;
    }
    else {
      *(undefined1 *)((long)target + 1) = 0xff;
      *(char *)((long)target + 2) = (char)(len >> 0x38);
      *(char *)((long)target + 3) = (char)(len >> 0x30);
      *(char *)((long)target + 4) = (char)(len >> 0x28);
      *(char *)((long)target + 5) = (char)(len >> 0x20);
      *(char *)((long)target + 6) = (char)(len >> 0x18);
      *(char *)((long)target + 7) = (char)(len >> 0x10);
      *(undefined1 *)((long)target + 8) = uVar3;
      lVar9 = 0xe;
      lVar2 = 0xd;
      lVar8 = 0xc;
      lVar4 = 0xb;
      lVar5 = 10;
      lVar7 = 9;
    }
  }
  uVar1 = uVar1 | 0x1020408;
  *(byte *)((long)target + lVar7) = bVar6;
  *(char *)((long)target + lVar5) = (char)uVar1;
  *(char *)((long)target + lVar4) = (char)(uVar1 >> 8);
  *(char *)((long)target + lVar8) = (char)(uVar1 >> 0x10);
  *(char *)((long)target + lVar2) = (char)(uVar1 >> 0x18);
  memcpy((void *)((long)target + lVar9),msg,len);
  websocket_xmask((void *)((long)target + lVar9),len,uVar1);
  return lVar9 + len;
}

Assistant:

static uint64_t websocket_client_wrap(void *target, void *msg, uint64_t len,
                                      unsigned char opcode, unsigned char first,
                                      unsigned char last, unsigned char rsv) {
  uint32_t mask = rand() | 0x01020408;
  ((uint8_t *)target)[0] = 0 |
                           /* opcode */ (((first ? opcode : 0) & 15)) |
                           /* rsv */ ((rsv & 7) << 4) |
                           /*fin*/ ((last & 1) << 7);
  if (len < 126) {
    ((uint8_t *)target)[1] = len | 128;
    ((uint8_t *)target)[2] = ((uint8_t *)(&mask))[0];
    ((uint8_t *)target)[3] = ((uint8_t *)(&mask))[1];
    ((uint8_t *)target)[4] = ((uint8_t *)(&mask))[2];
    ((uint8_t *)target)[5] = ((uint8_t *)(&mask))[3];
    memcpy(((uint8_t *)target) + 6, msg, len);
    websocket_xmask((uint8_t *)target + 6, len, mask);
    return len + 6;
  } else if (len < (1UL << 16)) {
    /* head is 4 bytes */
    ((uint8_t *)target)[1] = 126 | 128;
    websocket_u2str16(((uint8_t *)target + 2), len);
    ((uint8_t *)target)[4] = ((uint8_t *)(&mask))[0];
    ((uint8_t *)target)[5] = ((uint8_t *)(&mask))[1];
    ((uint8_t *)target)[6] = ((uint8_t *)(&mask))[2];
    ((uint8_t *)target)[7] = ((uint8_t *)(&mask))[3];
    memcpy((uint8_t *)target + 8, msg, len);
    websocket_xmask((uint8_t *)target + 8, len, mask);
    return len + 8;
  }
  /* Really Long Message  */
  ((uint8_t *)target)[1] = 255;
  websocket_u2str64(((uint8_t *)target + 2), len);
  ((uint8_t *)target)[10] = ((uint8_t *)(&mask))[0];
  ((uint8_t *)target)[11] = ((uint8_t *)(&mask))[1];
  ((uint8_t *)target)[12] = ((uint8_t *)(&mask))[2];
  ((uint8_t *)target)[13] = ((uint8_t *)(&mask))[3];
  memcpy((uint8_t *)target + 14, msg, len);
  websocket_xmask((uint8_t *)target + 14, len, mask);
  return len + 14;
}